

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O0

UChar32 ucptrie_internalGetRange_63
                  (UCPTrieGetRange *getRange,void *trie,UChar32 start,UCPMapRangeOption option,
                  uint32_t surrogateValue,UCPMapValueFilter *filter,void *context,uint32_t *pValue)

{
  uint32_t local_48;
  UChar32 end2;
  uint32_t value2;
  UChar32 end;
  UChar32 surrEnd;
  uint32_t value;
  UCPMapValueFilter *filter_local;
  UCPMapRangeOption local_28;
  uint32_t surrogateValue_local;
  UCPMapRangeOption option_local;
  UChar32 start_local;
  void *trie_local;
  UCPTrieGetRange *getRange_local;
  
  _surrEnd = filter;
  filter_local._4_4_ = surrogateValue;
  local_28 = option;
  surrogateValue_local = start;
  _option_local = trie;
  trie_local = getRange;
  if (option == UCPMAP_RANGE_NORMAL) {
    getRange_local._4_4_ = (*getRange)(trie,start,filter,context,pValue);
  }
  else {
    if (pValue == (uint32_t *)0x0) {
      pValue = (uint32_t *)&end;
    }
    value2 = 0xdbff;
    if (option == UCPMAP_RANGE_FIXED_ALL_SURROGATES) {
      value2 = 0xdfff;
    }
    end2 = (*getRange)(trie,start,filter,context,pValue);
    getRange_local._4_4_ = end2;
    if ((0xd7fe < end2) && ((int)surrogateValue_local <= (int)value2)) {
      if (*pValue == filter_local._4_4_) {
        if ((int)value2 <= end2) {
          return end2;
        }
      }
      else {
        if ((int)surrogateValue_local < 0xd800) {
          return 0xd7ff;
        }
        *pValue = filter_local._4_4_;
        if ((int)value2 < end2) {
          return value2;
        }
      }
      getRange_local._4_4_ =
           (*(code *)trie_local)(_option_local,value2 + 1,_surrEnd,context,&local_48);
      if (local_48 != filter_local._4_4_) {
        getRange_local._4_4_ = value2;
      }
    }
  }
  return getRange_local._4_4_;
}

Assistant:

U_CFUNC UChar32
ucptrie_internalGetRange(UCPTrieGetRange *getRange,
                         const void *trie, UChar32 start,
                         UCPMapRangeOption option, uint32_t surrogateValue,
                         UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    if (option == UCPMAP_RANGE_NORMAL) {
        return getRange(trie, start, filter, context, pValue);
    }
    uint32_t value;
    if (pValue == nullptr) {
        // We need to examine the range value even if the caller does not want it.
        pValue = &value;
    }
    UChar32 surrEnd = option == UCPMAP_RANGE_FIXED_ALL_SURROGATES ? 0xdfff : 0xdbff;
    UChar32 end = getRange(trie, start, filter, context, pValue);
    if (end < 0xd7ff || start > surrEnd) {
        return end;
    }
    // The range overlaps with surrogates, or ends just before the first one.
    if (*pValue == surrogateValue) {
        if (end >= surrEnd) {
            // Surrogates followed by a non-surrogateValue range,
            // or surrogates are part of a larger surrogateValue range.
            return end;
        }
    } else {
        if (start <= 0xd7ff) {
            return 0xd7ff;  // Non-surrogateValue range ends before surrogateValue surrogates.
        }
        // Start is a surrogate with a non-surrogateValue code *unit* value.
        // Return a surrogateValue code *point* range.
        *pValue = surrogateValue;
        if (end > surrEnd) {
            return surrEnd;  // Surrogate range ends before non-surrogateValue rest of range.
        }
    }
    // See if the surrogateValue surrogate range can be merged with
    // an immediately following range.
    uint32_t value2;
    UChar32 end2 = getRange(trie, surrEnd + 1, filter, context, &value2);
    if (value2 == surrogateValue) {
        return end2;
    }
    return surrEnd;
}